

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall
capnp::DynamicList::Reader::operator[](Reader *__return_storage_ptr__,Reader *this,uint index)

{
  double value;
  PointerReader reader;
  ListReader reader_00;
  StructReader reader_01;
  ListSchema schema;
  bool bVar1;
  char value_00;
  uchar value_01;
  ElementSize expectedElementSize;
  Which WVar2;
  short value_02;
  unsigned_short uVar3;
  int value_03;
  uint uVar4;
  long value_04;
  unsigned_long value_05;
  float value_06;
  Type TVar5;
  DynamicEnum value_07;
  PointerReader local_298;
  undefined1 local_278 [48];
  PointerReader local_248;
  Reader local_228;
  Schema local_208;
  DynamicEnum local_200;
  StructReader local_1f0;
  Schema local_1c0;
  Reader local_1b8;
  PointerReader local_180;
  ListReader local_160;
  Type local_130;
  Reader local_120;
  undefined1 local_e0 [8];
  ListSchema elementType;
  ArrayPtr<const_unsigned_char> local_b0;
  PointerReader local_a0;
  StringPtr local_80 [2];
  Fault local_60;
  Fault f;
  uint *local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  uint index_local;
  Reader *this_local;
  
  _kjCondition._36_4_ = index;
  local_50 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f.exception._4_4_ = size(this);
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
             (DebugExpression<unsigned_int&> *)&local_50,(uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    WVar2 = ListSchema::whichElementType(&this->schema);
    switch(WVar2) {
    case VOID:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListReader::getDataElement<capnp::Void>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__);
      break;
    case BOOL:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      bVar1 = capnp::_::ListReader::getDataElement<bool>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,bVar1);
      break;
    case INT8:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_00 = capnp::_::ListReader::getDataElement<signed_char>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_00);
      break;
    case INT16:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_02 = capnp::_::ListReader::getDataElement<short>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_02);
      break;
    case INT32:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_03 = capnp::_::ListReader::getDataElement<int>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_03);
      break;
    case INT64:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_04 = capnp::_::ListReader::getDataElement<long>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_04);
      break;
    case UINT8:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_01 = capnp::_::ListReader::getDataElement<unsigned_char>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_01);
      break;
    case UINT16:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      uVar3 = capnp::_::ListReader::getDataElement<unsigned_short>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,uVar3);
      break;
    case UINT32:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      uVar4 = capnp::_::ListReader::getDataElement<unsigned_int>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,uVar4);
      break;
    case UINT64:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_05 = capnp::_::ListReader::getDataElement<unsigned_long>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_05);
      break;
    case FLOAT32:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_06 = capnp::_::ListReader::getDataElement<float>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_06);
      break;
    case FLOAT64:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      value = capnp::_::ListReader::getDataElement<double>(&this->reader,uVar4);
      DynamicValue::Reader::Reader(__return_storage_ptr__,value);
      break;
    case TEXT:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListReader::getPointerElement(&local_a0,&this->reader,uVar4);
      local_80[0].content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>(&local_a0,(void *)0x0,0);
      DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)local_80);
      break;
    case DATA:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListReader::getPointerElement
                ((PointerReader *)&elementType.elementType.field_4,&this->reader,uVar4);
      local_b0 = (ArrayPtr<const_unsigned_char>)
                 capnp::_::PointerReader::getBlob<capnp::Data>
                           ((PointerReader *)&elementType.elementType.field_4,(void *)0x0,0);
      DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)&local_b0);
      break;
    case LIST:
      TVar5 = (Type)ListSchema::getListElementType(&this->schema);
      local_e0 = TVar5._0_8_;
      local_130.baseType = local_e0._0_2_;
      local_130.listDepth = local_e0[2];
      local_130.isImplicitParam = (bool)local_e0[3];
      local_130.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_e0._4_2_;
      local_130._6_2_ = local_e0._6_2_;
      elementType.elementType._0_8_ = TVar5.field_4;
      local_130.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
      _local_e0 = TVar5;
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListReader::getPointerElement(&local_180,&this->reader,uVar4);
      WVar2 = ListSchema::whichElementType((ListSchema *)local_e0);
      expectedElementSize = anon_unknown_70::elementSizeFor(WVar2);
      capnp::_::PointerReader::getList(&local_160,&local_180,expectedElementSize,(word *)0x0);
      schema.elementType.field_4.schema = local_130.field_4.schema;
      schema.elementType.baseType = local_130.baseType;
      schema.elementType.listDepth = local_130.listDepth;
      schema.elementType.isImplicitParam = local_130.isImplicitParam;
      schema.elementType.field_3 = local_130.field_3;
      schema.elementType._6_2_ = local_130._6_2_;
      reader_00.capTable = local_160.capTable;
      reader_00.segment = local_160.segment;
      reader_00.ptr = local_160.ptr;
      reader_00.elementCount = local_160.elementCount;
      reader_00.step = local_160.step;
      reader_00.structDataSize = local_160.structDataSize;
      reader_00.structPointerCount = local_160.structPointerCount;
      reader_00.elementSize = local_160.elementSize;
      reader_00._39_1_ = local_160._39_1_;
      reader_00.nestingLimit = local_160.nestingLimit;
      reader_00._44_4_ = local_160._44_4_;
      Reader(&local_120,schema,reader_00);
      DynamicValue::Reader::Reader(__return_storage_ptr__,&local_120);
      break;
    case ENUM:
      local_208.raw = (RawBrandedSchema *)ListSchema::getEnumElementType(&this->schema);
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      uVar3 = capnp::_::ListReader::getDataElement<unsigned_short>(&this->reader,uVar4);
      DynamicEnum::DynamicEnum(&local_200,(EnumSchema)local_208.raw,uVar3);
      value_07._10_6_ = 0;
      value_07.schema.super_Schema.raw = local_200.schema.super_Schema.raw;
      value_07.value = local_200.value;
      DynamicValue::Reader::Reader(__return_storage_ptr__,value_07);
      break;
    case STRUCT:
      local_1c0.raw = (RawBrandedSchema *)ListSchema::getStructElementType(&this->schema);
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListReader::getStructElement(&local_1f0,&this->reader,uVar4);
      reader_01.capTable = local_1f0.capTable;
      reader_01.segment = local_1f0.segment;
      reader_01.data = local_1f0.data;
      reader_01.pointers = local_1f0.pointers;
      reader_01.dataSize = local_1f0.dataSize;
      reader_01.pointerCount = local_1f0.pointerCount;
      reader_01._38_2_ = local_1f0._38_2_;
      reader_01.nestingLimit = local_1f0.nestingLimit;
      reader_01._44_4_ = local_1f0._44_4_;
      DynamicStruct::Reader::Reader(&local_1b8,(StructSchema)local_1c0.raw,reader_01);
      DynamicValue::Reader::Reader(__return_storage_ptr__,&local_1b8);
      break;
    case INTERFACE:
      local_278._16_8_ = ListSchema::getInterfaceElementType(&this->schema);
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListReader::getPointerElement(&local_298,&this->reader,uVar4);
      capnp::_::PointerReader::getCapability((PointerReader *)local_278);
      DynamicCapability::Client::Client
                ((Client *)(local_278 + 0x18),(InterfaceSchema)local_278._16_8_,
                 (Own<capnp::ClientHook,_std::nullptr_t> *)local_278);
      DynamicValue::Reader::Reader(__return_storage_ptr__,(Client *)(local_278 + 0x18));
      DynamicCapability::Client::~Client((Client *)(local_278 + 0x18));
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                ((Own<capnp::ClientHook,_std::nullptr_t> *)local_278);
      break;
    case ANY_POINTER:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListReader::getPointerElement(&local_248,&this->reader,uVar4);
      reader.capTable = local_248.capTable;
      reader.segment = local_248.segment;
      reader.pointer = local_248.pointer;
      reader.nestingLimit = local_248.nestingLimit;
      reader._28_4_ = local_248._28_4_;
      AnyPointer::Reader::Reader(&local_228,reader);
      DynamicValue::Reader::Reader(__return_storage_ptr__,&local_228);
      break;
    default:
      DynamicValue::Reader::Reader(__return_storage_ptr__,(void *)0x0);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x412,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
             (DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
             (char (*) [26])"List index out-of-bounds.");
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

DynamicValue::Reader DynamicList::Reader::operator[](uint index) const {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return reader.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();
      return DynamicList::Reader(elementType,
          reader.getPointerElement(bounded(index) * ELEMENTS)
                .getList(elementSizeFor(elementType.whichElementType()), nullptr));
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Reader(schema.getStructElementType(),
                                   reader.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         reader.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      return AnyPointer::Reader(reader.getPointerElement(bounded(index) * ELEMENTS));

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       reader.getPointerElement(bounded(index) * ELEMENTS)
                                             .getCapability());
  }

  return nullptr;
}